

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_lb.c
# Opt level: O2

void gga_lb_init(xc_func_type *p)

{
  int iVar1;
  undefined4 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  puVar2 = (undefined4 *)malloc(0x18);
  p->params = puVar2;
  iVar1 = p->info->number;
  if (iVar1 == 0xa0) {
    uVar3 = 0;
    uVar4 = 0x3ff00000;
    uVar5 = 0x9999999a;
    uVar6 = 0x3fa99999;
  }
  else {
    if (iVar1 != 0xb6) {
      return;
    }
    uVar3 = 0x70a3d70a;
    uVar4 = 0x3ff30a3d;
    uVar5 = 0x47ae147b;
    uVar6 = 0x3f847ae1;
  }
  *puVar2 = uVar3;
  puVar2[1] = uVar4;
  puVar2[2] = uVar5;
  puVar2[3] = uVar6;
  *(undefined8 *)(puVar2 + 4) = 0x3ff0000000000000;
  return;
}

Assistant:

static void
gga_lb_init(xc_func_type *p)
{
  gga_x_lb_params *params;

  assert(p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_x_lb_params));
  params = (gga_x_lb_params *) (p->params);

  switch(p->info->number){
  case XC_GGA_X_LB:
    params->alpha = 1.0;
    params->beta  = 0.05;
    params->gamma = 1.0;
    break;
  case XC_GGA_X_LBM:
    params->alpha = 1.19;
    params->beta  = 0.01;
    params->gamma = 1.0;
    break;
  }
}